

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowImplX11.cpp
# Opt level: O1

void __thiscall sf::priv::WindowImplX11::requestFocus(WindowImplX11 *this)

{
  char cVar1;
  int iVar2;
  ostream *poVar3;
  long lVar4;
  undefined8 *puVar5;
  bool bVar6;
  XWindowAttributes attributes;
  Lock local_a0 [11];
  int local_44;
  
  Lock::Lock(local_a0,(Mutex *)&(anonymous_namespace)::WindowsImplX11Impl::allWindowsMutex);
  for (puVar5 = (anonymous_namespace)::WindowsImplX11Impl::allWindows;
      bVar6 = puVar5 == DAT_00288ac8, !bVar6; puVar5 = puVar5 + 1) {
    cVar1 = (**(code **)(*(long *)*puVar5 + 0x78))();
    if (cVar1 != '\0') break;
  }
  Lock::~Lock(local_a0);
  iVar2 = XGetWindowAttributes(this->m_display,this->m_window,local_a0);
  if (iVar2 == 0) {
    poVar3 = err();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"Failed to check if window is viewable while requesting focus",0x3c);
    std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
  }
  else if (bVar6 || local_44 != 2) {
    lVar4 = XGetWMHints(this->m_display,this->m_window);
    if (lVar4 == 0) {
      lVar4 = XAllocWMHints();
    }
    *(byte *)(lVar4 + 1) = *(byte *)(lVar4 + 1) | 1;
    XSetWMHints(this->m_display,this->m_window,lVar4);
    XFree(lVar4);
  }
  else {
    grabFocus(this);
  }
  return;
}

Assistant:

void WindowImplX11::requestFocus()
{
    using namespace WindowsImplX11Impl;

    // Focus is only stolen among SFML windows, not between applications
    // Check the global list of windows to find out whether an SFML window has the focus
    // Note: can't handle console and other non-SFML windows belonging to the application.
    bool sfmlWindowFocused = false;

    {
        Lock lock(allWindowsMutex);
        for (std::vector<WindowImplX11*>::iterator itr = allWindows.begin(); itr != allWindows.end(); ++itr)
        {
            if ((*itr)->hasFocus())
            {
                sfmlWindowFocused = true;
                break;
            }
        }
    }

    // Check if window is viewable (not on other desktop, ...)
    // TODO: Check also if minimized
    XWindowAttributes attributes;
    if (XGetWindowAttributes(m_display, m_window, &attributes) == 0)
    {
        sf::err() << "Failed to check if window is viewable while requesting focus" << std::endl;
        return; // error getting attribute
    }

    bool windowViewable = (attributes.map_state == IsViewable);

    if (sfmlWindowFocused && windowViewable)
    {
        // Another SFML window of this application has the focus and the current window is viewable:
        // steal focus (i.e. bring window to the front and give it input focus)
        grabFocus();
    }
    else
    {
        // Otherwise: display urgency hint (flashing application logo)
        // Ensure WM hints exist, allocate if necessary
        XWMHints* hints = XGetWMHints(m_display, m_window);
        if (hints == NULL)
            hints = XAllocWMHints();

        // Add urgency (notification) flag to hints
        hints->flags |= XUrgencyHint;
        XSetWMHints(m_display, m_window, hints);
        XFree(hints);
    }
}